

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *val,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *stab,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *update,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *lowBound,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *upBound,int start,int incr)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  pointer pnVar4;
  undefined8 uVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SPxId *pSVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  DataKey DVar11;
  DataKey DVar12;
  undefined1 auVar13 [16];
  int iVar14;
  fpclass_type fVar15;
  fpclass_type fVar16;
  ulong uVar17;
  DataKey DVar18;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar19;
  cpp_dec_float<50U,_int,_void> *v;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  DataKey *pDVar21;
  uint *puVar22;
  undefined1 local_178 [16];
  DataKey local_168;
  uint uStack_160;
  undefined3 uStack_15b;
  DataKey local_158;
  int local_150;
  bool local_14c;
  DataKey local_148;
  uint local_140;
  uint local_13c;
  DataKey local_138;
  DataKey DStack_130;
  DataKey local_128;
  uint uStack_120;
  undefined3 uStack_11b;
  DataKey local_118;
  int local_110;
  bool local_10c;
  undefined8 local_108;
  undefined4 local_fc;
  pointer local_f8;
  cpp_dec_float<50U,_int,_void> *local_f0;
  undefined1 local_e8 [16];
  uint local_d8 [3];
  undefined3 uStack_cb;
  uint local_c8 [3];
  bool local_bc;
  undefined8 local_b8;
  Type local_ac;
  cpp_dec_float<50U,_int,_void> local_a8;
  DataKey *local_70;
  DataKey *local_68;
  pointer local_60;
  pointer local_58;
  cpp_dec_float<50U,_int,_void> *local_50;
  uint *local_48;
  long local_40;
  uint *local_38;
  
  local_108 = 0xa00000000;
  local_138.info = 0;
  local_138.idx = 0;
  DStack_130.info = 0;
  DStack_130.idx = 0;
  local_128.info = 0;
  local_128.idx = 0;
  _uStack_120 = 0;
  uStack_11b = 0;
  local_118.info = 0;
  local_118.idx = 0;
  local_110 = 0;
  local_10c = false;
  local_ac = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_type;
  if (local_ac == LEAVE) {
    local_fc = 0;
  }
  else {
    pSVar6 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_fc = (undefined4)CONCAT71((int7)((ulong)pSVar6 >> 8),pSVar6->theRep == ROW);
  }
  iVar14 = (update->thedelta).super_IdxSet.num;
  if (iVar14 <= start) {
    return 0xffffffff;
  }
  local_58 = (upBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (lowBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_f8 = (update->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  piVar3 = (update->thedelta).super_IdxSet.idx;
  pnVar4 = (update->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (uint *)(piVar3 + iVar14);
  puVar22 = (uint *)(piVar3 + start);
  local_48 = (stab->m_backend).data._M_elems + 1;
  local_40 = (long)incr << 2;
  local_13c = 0xffffffff;
  local_140 = 0xffffffff;
  local_f0 = &max->m_backend;
  local_70 = (DataKey *)bestDelta;
  local_68 = (DataKey *)val;
  local_50 = &stab->m_backend;
  do {
    uVar2 = *puVar22;
    uVar5 = *(undefined8 *)((long)&pnVar4[(int)uVar2].m_backend.data + 0x20);
    local_a8.data._M_elems[8] = (uint)uVar5;
    local_a8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)&pnVar4[(int)uVar2].m_backend.data;
    uVar8 = *(undefined8 *)((long)&pnVar4[(int)uVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar4[(int)uVar2].m_backend.data + 0x10);
    uVar9 = *(undefined8 *)puVar1;
    uVar10 = *(undefined8 *)(puVar1 + 2);
    local_a8.data._M_elems[4] = (uint)uVar9;
    local_a8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
    local_a8.data._M_elems[6] = (uint)uVar10;
    local_a8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
    local_a8.data._M_elems[0] = (uint)uVar5;
    local_a8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
    local_a8.data._M_elems[2] = (uint)uVar8;
    local_a8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
    local_a8.exp = pnVar4[(int)uVar2].m_backend.exp;
    local_a8.neg = pnVar4[(int)uVar2].m_backend.neg;
    local_a8.fpclass = pnVar4[(int)uVar2].m_backend.fpclass;
    local_a8.prec_elem = pnVar4[(int)uVar2].m_backend.prec_elem;
    if (local_ac == LEAVE) {
      pSVar6 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      if (this->iscoid == true) {
        pDVar19 = (pSVar6->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.costat;
      }
      else {
        pDVar19 = (pSVar6->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.stat;
      }
      if (pSVar6->theRep * pDVar19->data[(int)uVar2] < 1) goto LAB_002d91cd;
    }
    else {
LAB_002d91cd:
      if ((char)local_fc == '\0') {
LAB_002d9233:
        fVar15 = local_a8.fpclass;
      }
      else {
        pSVar6 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        pSVar7 = (pSVar6->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data;
        if (pSVar7[(int)uVar2].super_DataKey.info < 1) goto LAB_002d9233;
        SPxColId::SPxColId((SPxColId *)local_178,pSVar7 + (int)uVar2);
        iVar14 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                 ::number(&(pSVar6->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set,(DataKey *)local_178);
        stab = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_50;
        if ((pSVar6->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.colstat.data[iVar14] == P_FIXED) goto LAB_002d97a4;
        fVar15 = local_a8.fpclass;
      }
      fVar16 = (stab->m_backend).fpclass;
      if (fVar16 == cpp_dec_float_NaN || fVar15 == cpp_dec_float_NaN) {
LAB_002d9322:
        local_158 = *(DataKey *)((stab->m_backend).data._M_elems + 8);
        auVar13 = *(undefined1 (*) [16])(stab->m_backend).data._M_elems;
        local_168 = *(DataKey *)((stab->m_backend).data._M_elems + 4);
        uVar5 = *(undefined8 *)((stab->m_backend).data._M_elems + 6);
        _uStack_160 = (undefined5)uVar5;
        uStack_15b = (undefined3)((ulong)uVar5 >> 0x28);
        local_150 = (stab->m_backend).exp;
        local_14c = (stab->m_backend).neg;
        local_148.idx = (stab->m_backend).prec_elem;
        local_148.info = fVar16;
        local_178._0_4_ = (undefined4)*(undefined8 *)(stab->m_backend).data._M_elems;
        if (local_178._0_4_ != 0 || fVar16 != cpp_dec_float_finite) {
          local_14c = (bool)(local_14c ^ 1);
        }
        local_178 = auVar13;
        if (((fVar16 == cpp_dec_float_NaN) || (local_a8.fpclass == cpp_dec_float_NaN)) ||
           (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_a8,(cpp_dec_float<50U,_int,_void> *)local_178), -1 < iVar14))
        goto LAB_002d97a4;
        pcVar20 = &local_60[(int)uVar2].m_backend;
        local_b8._0_4_ = cpp_dec_float_finite;
        local_b8._4_4_ = 10;
        local_e8 = (undefined1  [16])0x0;
        local_d8[0] = 0;
        local_d8[1] = 0;
        stack0xffffffffffffff30 = 0;
        uStack_cb = 0;
        local_c8[0] = 0;
        local_c8[1] = 0;
        local_c8[2] = 0;
        local_bc = false;
        if ((cpp_dec_float<50U,_int,_void> *)local_e8 == &local_f8[(int)uVar2].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_e8,pcVar20);
          if (local_e8._0_4_ != 0 || (fpclass_type)local_b8 != cpp_dec_float_finite) {
            local_bc = (bool)(local_bc ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<50U,_int,_void> *)local_e8 != pcVar20) {
            local_c8._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
            local_e8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
            local_d8._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
            stack0xffffffffffffff30 = (undefined5)uVar5;
            uStack_cb = (undefined3)((ulong)uVar5 >> 0x28);
            local_c8[2] = pcVar20->exp;
            local_bc = pcVar20->neg;
            local_b8._0_4_ = pcVar20->fpclass;
            local_b8._4_4_ = pcVar20->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_f8[(int)uVar2].m_backend);
        }
        local_148.info = 0;
        local_148.idx = 10;
        local_178 = (undefined1  [16])0x0;
        local_168.info = 0;
        local_168.idx = 0;
        _uStack_160 = 0;
        uStack_15b = 0;
        local_158.info = 0;
        local_158.idx = 0;
        local_150 = 0;
        local_14c = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_178,
                   (cpp_dec_float<50U,_int,_void> *)local_e8,&local_a8);
        auVar13 = local_178;
        local_118 = local_158;
        local_128 = local_168;
        _uStack_120 = _uStack_160;
        uStack_11b = uStack_15b;
        local_138.info = local_178._0_4_;
        local_138.idx = local_178._4_4_;
        DStack_130.info = local_178._8_4_;
        DStack_130.idx = local_178._12_4_;
        local_110 = local_150;
        local_10c = local_14c;
        local_108._0_4_ = local_148.info;
        local_108._4_4_ = local_148.idx;
        DVar18 = local_148;
        local_178 = auVar13;
        DVar11 = local_148;
        DVar12 = local_138;
        if ((local_148.info != 2) &&
           (DVar11 = (DataKey)local_108, local_f0->fpclass != cpp_dec_float_NaN)) {
          iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&local_138,local_f0);
          DVar18 = (DataKey)(local_108 & 0xffffffff);
          DVar11 = (DataKey)local_108;
          DVar12 = local_138;
          if (iVar14 < 1) {
            local_68[4] = local_118;
            DVar12.idx._1_3_ = uStack_11b;
            DVar12._0_5_ = _uStack_120;
            local_68[2] = local_128;
            local_68[3] = DVar12;
            *local_68 = local_138;
            local_68[1] = DStack_130;
            local_68[5].info = local_110;
            *(bool *)&local_68[5].idx = local_10c;
            local_68[6].info = (fpclass_type)local_108;
            local_68[6].idx = local_108._4_4_;
            (stab->m_backend).data._M_elems[0] = local_a8.data._M_elems[0];
            local_48[8] = local_a8.data._M_elems[9];
            *(ulong *)(local_48 + 4) = CONCAT44(local_a8.data._M_elems[6],local_a8.data._M_elems[5])
            ;
            *(ulong *)(local_48 + 6) = CONCAT44(local_a8.data._M_elems[8],local_a8.data._M_elems[7])
            ;
            *(ulong *)local_48 = CONCAT44(local_a8.data._M_elems[2],local_a8.data._M_elems[1]);
            *(ulong *)(local_48 + 2) = CONCAT44(local_a8.data._M_elems[4],local_a8.data._M_elems[3])
            ;
            (stab->m_backend).exp = local_a8.exp;
            (stab->m_backend).neg =
                 (bool)((local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite)
                       ^ local_a8.neg);
            (stab->m_backend).fpclass = local_a8.fpclass;
            (stab->m_backend).prec_elem = local_a8.prec_elem;
            local_140 = uVar2;
            goto LAB_002d97a4;
          }
        }
      }
      else {
        iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_a8,&stab->m_backend);
        if (iVar14 < 1) {
          fVar16 = (stab->m_backend).fpclass;
          goto LAB_002d9322;
        }
        pcVar20 = &local_58[(int)uVar2].m_backend;
        local_b8._0_4_ = cpp_dec_float_finite;
        local_b8._4_4_ = 10;
        local_e8 = (undefined1  [16])0x0;
        local_d8[0] = 0;
        local_d8[1] = 0;
        stack0xffffffffffffff30 = 0;
        uStack_cb = 0;
        local_c8[0] = 0;
        local_c8[1] = 0;
        local_c8[2] = 0;
        local_bc = false;
        if ((cpp_dec_float<50U,_int,_void> *)local_e8 == &local_f8[(int)uVar2].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_e8,pcVar20);
          if (local_e8._0_4_ != 0 || (fpclass_type)local_b8 != cpp_dec_float_finite) {
            local_bc = (bool)(local_bc ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<50U,_int,_void> *)local_e8 != pcVar20) {
            local_c8._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
            local_e8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
            local_d8._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
            stack0xffffffffffffff30 = (undefined5)uVar5;
            uStack_cb = (undefined3)((ulong)uVar5 >> 0x28);
            local_c8[2] = pcVar20->exp;
            local_bc = pcVar20->neg;
            local_b8._0_4_ = pcVar20->fpclass;
            local_b8._4_4_ = pcVar20->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_f8[(int)uVar2].m_backend);
        }
        local_148.info = 0;
        local_148.idx = 10;
        local_178 = (undefined1  [16])0x0;
        local_168.info = 0;
        local_168.idx = 0;
        _uStack_160 = 0;
        uStack_15b = 0;
        local_158.info = 0;
        local_158.idx = 0;
        local_150 = 0;
        local_14c = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_178,
                   (cpp_dec_float<50U,_int,_void> *)local_e8,&local_a8);
        auVar13 = local_178;
        local_118 = local_158;
        local_128 = local_168;
        _uStack_120 = _uStack_160;
        uStack_11b = uStack_15b;
        local_138.info = local_178._0_4_;
        local_138.idx = local_178._4_4_;
        DVar12 = local_138;
        local_138.info = local_178._0_4_;
        local_138.idx = local_178._4_4_;
        DStack_130.info = local_178._8_4_;
        DStack_130.idx = local_178._12_4_;
        local_110 = local_150;
        local_10c = local_14c;
        local_108._0_4_ = local_148.info;
        local_108._4_4_ = local_148.idx;
        DVar18 = local_148;
        local_178 = auVar13;
        DVar11 = local_148;
        if ((local_148.info != 2) &&
           (DVar11 = (DataKey)local_108, local_f0->fpclass != cpp_dec_float_NaN)) {
          iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&local_138,local_f0);
          DVar18 = (DataKey)(local_108 & 0xffffffff);
          DVar11 = (DataKey)local_108;
          DVar12 = local_138;
          if (iVar14 < 1) {
            local_68[4] = local_118;
            DVar18.idx._1_3_ = uStack_11b;
            DVar18._0_5_ = _uStack_120;
            local_68[2] = local_128;
            local_68[3] = DVar18;
            *local_68 = local_138;
            local_68[1] = DStack_130;
            local_68[5].info = local_110;
            *(bool *)&local_68[5].idx = local_10c;
            local_68[6].info = (fpclass_type)local_108;
            local_68[6].idx = local_108._4_4_;
            *(ulong *)((stab->m_backend).data._M_elems + 8) =
                 CONCAT44(local_a8.data._M_elems[9],local_a8.data._M_elems[8]);
            *(ulong *)((stab->m_backend).data._M_elems + 4) =
                 CONCAT44(local_a8.data._M_elems[5],local_a8.data._M_elems[4]);
            *(ulong *)((stab->m_backend).data._M_elems + 6) =
                 CONCAT44(local_a8.data._M_elems[7],local_a8.data._M_elems[6]);
            *(ulong *)(stab->m_backend).data._M_elems =
                 CONCAT44(local_a8.data._M_elems[1],local_a8.data._M_elems[0]);
            *(ulong *)((stab->m_backend).data._M_elems + 2) =
                 CONCAT44(local_a8.data._M_elems[3],local_a8.data._M_elems[2]);
            (stab->m_backend).exp = local_a8.exp;
            (stab->m_backend).neg = local_a8.neg;
            (stab->m_backend).fpclass = local_a8.fpclass;
            (stab->m_backend).prec_elem = local_a8.prec_elem;
            local_140 = uVar2;
            goto LAB_002d97a4;
          }
        }
      }
      local_138 = DVar12;
      local_108 = (ulong)DVar11;
      if (((SUB84(DVar18,0) != 2) && ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&local_138,&best->m_backend),
         0 < iVar14)) {
        *(DataKey *)((best->m_backend).data._M_elems + 8) = local_118;
        *(DataKey *)((best->m_backend).data._M_elems + 4) = local_128;
        *(ulong *)((best->m_backend).data._M_elems + 6) = CONCAT35(uStack_11b,_uStack_120);
        (best->m_backend).data._M_elems[0] = local_138.info;
        (best->m_backend).data._M_elems[1] = local_138.idx;
        *(DataKey *)((best->m_backend).data._M_elems + 2) = DStack_130;
        (best->m_backend).exp = local_110;
        (best->m_backend).neg = local_10c;
        (best->m_backend).fpclass = (fpclass_type)local_108;
        (best->m_backend).prec_elem = local_108._4_4_;
        local_13c = uVar2;
      }
    }
LAB_002d97a4:
    uVar2 = local_140;
    puVar22 = (uint *)((long)puVar22 + local_40);
  } while (puVar22 < local_38);
  if ((int)local_13c < 1 || -1 < (int)local_140) {
    return local_140;
  }
  uVar17 = (ulong)local_13c;
  if (pnVar4[uVar17].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002d989d:
    pcVar20 = &local_f8[uVar17].m_backend;
    v = &local_60[uVar17].m_backend;
    local_148.info = 0;
    local_148.idx = 10;
    local_178 = (undefined1  [16])0x0;
    local_168.info = 0;
    local_168.idx = 0;
    _uStack_160 = 0;
    uStack_15b = 0;
    local_158.info = 0;
    local_158.idx = 0;
    local_150 = 0;
    local_14c = false;
    if ((cpp_dec_float<50U,_int,_void> *)local_178 == v) {
LAB_002d9949:
      pDVar21 = local_70;
      local_148.info = 0;
      local_148.idx = 10;
      local_14c = false;
      local_150 = 0;
      local_158.info = 0;
      local_158.idx = 0;
      uStack_15b = 0;
      _uStack_160 = 0;
      local_168.info = 0;
      local_168.idx = 0;
      local_178 = (undefined1  [16])0x0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)local_178,pcVar20);
      if (local_178._0_4_ != 0 || local_148.info != cpp_dec_float_finite) {
        local_14c = (bool)(local_14c ^ 1);
      }
      goto LAB_002d995a;
    }
    if ((cpp_dec_float<50U,_int,_void> *)local_178 != pcVar20) {
      local_158 = *(DataKey *)((pcVar20->data)._M_elems + 8);
      local_178 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
      local_168 = *(DataKey *)((pcVar20->data)._M_elems + 4);
      uVar5 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      _uStack_160 = (undefined5)uVar5;
      uStack_15b = (undefined3)((ulong)uVar5 >> 0x28);
      local_150 = pcVar20->exp;
      local_14c = pcVar20->neg;
      local_148.info = pcVar20->fpclass;
      local_148.idx = pcVar20->prec_elem;
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<50U,_int,_void> *)local_178,0,(type *)0x0);
    iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&pnVar4[uVar17].m_backend,(cpp_dec_float<50U,_int,_void> *)local_178);
    if (iVar14 < 1) goto LAB_002d989d;
    pcVar20 = &local_58[uVar17].m_backend;
    v = &local_f8[uVar17].m_backend;
    local_148.info = 0;
    local_148.idx = 10;
    local_178 = (undefined1  [16])0x0;
    local_168.info = 0;
    local_168.idx = 0;
    _uStack_160 = 0;
    uStack_15b = 0;
    local_158.info = 0;
    local_158.idx = 0;
    local_150 = 0;
    local_14c = false;
    if ((cpp_dec_float<50U,_int,_void> *)local_178 == v) goto LAB_002d9949;
    if ((cpp_dec_float<50U,_int,_void> *)local_178 != pcVar20) {
      local_158 = *(DataKey *)((pcVar20->data)._M_elems + 8);
      local_178 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
      local_168 = *(DataKey *)((pcVar20->data)._M_elems + 4);
      uVar5 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
      _uStack_160 = (undefined5)uVar5;
      uStack_15b = (undefined3)((ulong)uVar5 >> 0x28);
      local_150 = pcVar20->exp;
      local_14c = pcVar20->neg;
      local_148.info = pcVar20->fpclass;
      local_148.idx = pcVar20->prec_elem;
    }
  }
  pDVar21 = local_70;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            ((cpp_dec_float<50U,_int,_void> *)local_178,v);
LAB_002d995a:
  pDVar21[4] = local_158;
  DVar11.idx._1_3_ = uStack_15b;
  DVar11._0_5_ = _uStack_160;
  pDVar21[2] = local_168;
  pDVar21[3] = DVar11;
  pDVar21->info = local_178._0_4_;
  pDVar21->idx = local_178._4_4_;
  pDVar21[1].info = local_178._8_4_;
  pDVar21[1].idx = local_178._12_4_;
  pDVar21[5].info = local_150;
  *(bool *)&pDVar21[5].idx = local_14c;
  pDVar21[6] = local_148;
  return uVar2;
}

Assistant:

int SPxFastRT<R>::maxSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] > 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}